

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

void __thiscall DNSResolve::RemoveCallback(DNSResolve *this,IDNSNotify *callback)

{
  map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  *this_01;
  size_type sVar1;
  mapped_type *pmVar2;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>
  __position;
  size_type sVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
  pVar4;
  string hostname;
  IDNSNotify *local_50;
  key_type local_48;
  
  this_00 = &this->cb_to_hostname_;
  local_50 = callback;
  sVar1 = std::
          map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(this_00,&local_50);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<IDNSNotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_50);
    std::__cxx11::string::string((string *)&local_48,(string *)pmVar2);
    this_01 = &this->hostname_to_cb_;
    pVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
            ::equal_range(&this_01->_M_t,&local_48);
    for (__position = pVar4.first._M_node; __position._M_node != pVar4.second._M_node._M_node;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node)) {
      if (*(IDNSNotify **)(__position._M_node + 2) == local_50) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IDNSNotify*>,std::_Select1st<std::pair<std::__cxx11::string_const,IDNSNotify*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDNSNotify*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,IDNSNotify*>,std::_Select1st<std::pair<std::__cxx11::string_const,IDNSNotify*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IDNSNotify*>>>
                            *)this_01,(iterator)__position._M_node);
      }
    }
    sVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IDNSNotify_*>_>_>
            ::count(&this_01->_M_t,&local_48);
    if (sVar3 == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::erase(&(this->hostname_status_)._M_t,&local_48);
    }
    std::
    _Rb_tree<IDNSNotify_*,_std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<IDNSNotify_*>,_std::allocator<std::pair<IDNSNotify_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(&this_00->_M_t,&local_50);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void DNSResolve::RemoveCallback(IDNSNotify* callback)
{
    if (cb_to_hostname_.count(callback) == 0)
    {
        return;
    }
    string hostname = cb_to_hostname_[callback];

    auto range_callbacks = hostname_to_cb_.equal_range(hostname);
    while (range_callbacks.first != range_callbacks.second)
    {
        if (range_callbacks.first->second == callback)
        {
            hostname_to_cb_.erase(range_callbacks.first);
        }
        ++range_callbacks.first;
    }
    if (hostname_to_cb_.count(hostname) == 0)
    {
        hostname_status_.erase(hostname);
    }
    cb_to_hostname_.erase(callback);
}